

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Expression::visit<slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
          (Expression *this,PortBackrefVisitor *visitor)

{
  PortBackrefVisitor *in_RSI;
  Expression *in_RDI;
  Expression *unaff_retaddr;
  
  visitExpression<slang::ast::Expression_const,slang::ast::(anonymous_namespace)::PortBackrefVisitor&>
            (unaff_retaddr,in_RDI,in_RSI);
  return;
}

Assistant:

decltype(auto) Expression::visit(TVisitor&& visitor, Args&&... args) const {
    return visitExpression(this, visitor, std::forward<Args>(args)...);
}